

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O1

DataViewPtr __thiscall
Rml::Factory::InstanceDataView
          (Factory *this,String *type_name,Element *element,bool is_structural_view)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  iterator iVar4;
  size_t sVar5;
  
  if ((element != (Element *)0x0) ||
     (bVar3 = Assert("RMLUI_ASSERT(element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Factory.cpp"
                     ,0x265), bVar3)) {
    if (is_structural_view) {
      if (((factory_data._8_8_ != 0) ||
          (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                          "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                          ,0x46), bVar3)) &&
         ((iVar4 = itlib::
                   flat_map<std::__cxx11::string,Rml::DataViewInstancer*,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>,std::allocator<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>>>>
                   ::find<std::__cxx11::string>
                             ((flat_map<std::__cxx11::string,Rml::DataViewInstancer*,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>,std::allocator<std::pair<std::__cxx11::string,Rml::DataViewInstancer*>>>>
                               *)(factory_data._8_8_ + 0xca8),type_name), factory_data._8_8_ != 0 ||
          (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                          "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                          ,0x46), bVar3)))) {
        if (iVar4._M_current !=
            *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>
              **)(factory_data._8_8_ + 0xcb0)) {
LAB_0023e9f6:
          (*(iVar4._M_current)->second->_vptr_DataViewInstancer[2])
                    (this,(iVar4._M_current)->second,element);
          return (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)
                 (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)this;
        }
LAB_0023e968:
        *(undefined8 *)this = 0;
        return (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)
               (__uniq_ptr_data<Rml::DataView,_Rml::Releaser<Rml::DataView>,_true,_true>)this;
      }
    }
    else if ((factory_data._8_8_ != 0) ||
            (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                            "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                            ,0x46), bVar3)) {
      uVar2 = factory_data._8_8_;
      sVar5 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,Rml::DataViewInstancer*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::findIdx<std::__cxx11::string>
                        ((Table<true,80ul,std::__cxx11::string,Rml::DataViewInstancer*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                          *)(factory_data._8_8_ + 0xc48),type_name);
      iVar4._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>
            *)(sVar5 * 0x28 + *(long *)(uVar2 + 0xc48));
      if ((factory_data._8_8_ != 0) ||
         (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                         ,0x46), bVar3)) {
        if (iVar4._M_current !=
            *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*>
              **)(factory_data._8_8_ + 0xc50)) goto LAB_0023e9f6;
        goto LAB_0023e968;
      }
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

DataViewPtr Factory::InstanceDataView(const String& type_name, Element* element, bool is_structural_view)
{
	RMLUI_ASSERT(element);

	if (is_structural_view)
	{
		auto it = factory_data->structural_data_view_instancers.find(type_name);
		if (it != factory_data->structural_data_view_instancers.end())
			return it->second->InstanceView(element);
	}
	else
	{
		auto it = factory_data->data_view_instancers.find(type_name);
		if (it != factory_data->data_view_instancers.end())
			return it->second->InstanceView(element);
	}
	return nullptr;
}